

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ag::BitConverter::Get
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          agvariant *v)

{
  variant_alternative_t<1UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> vVar1;
  pointer pcVar2;
  allocator_type *paVar3;
  variant_alternative_t<4UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar4;
  ulong uVar5;
  variant_alternative_t<1UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar6;
  variant_alternative_t<3UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> *pvVar7;
  pointer puVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  initializer_list<unsigned_char> __l;
  allocator_type local_46;
  allocator_type local_45;
  variant_alternative_t<3UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_> local_44
  ;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  switch((v->
         super__Variant_base<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Move_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
         .
         super__Copy_assign_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
         .super__Move_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>.
         super__Copy_ctor_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>.
         super__Variant_storage_alias<char,_unsigned_int,_int,_float,_std::__cxx11::basic_string<char>_>
         ._M_index) {
  case '\0':
    paVar3 = (allocator_type *)std::get<0ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    local_46 = *paVar3;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_46;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,__l,&local_45);
    break;
  case '\x01':
    pvVar6 = std::get<1ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    goto LAB_001055b3;
  case '\x02':
    pvVar6 = (variant_alternative_t<1UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_>
              *)std::get<2ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
LAB_001055b3:
    vVar1 = *pvVar6;
    puVar8 = (pointer)operator_new(4);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = puVar8;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = puVar8 + 4;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = puVar8 + 4;
    *puVar8 = (uchar)vVar1;
    puVar8[1] = (uchar)(vVar1 >> 8);
    puVar8[2] = (uchar)(vVar1 >> 0x10);
    puVar8[3] = (uchar)(vVar1 >> 0x18);
    break;
  case '\x03':
    pvVar7 = std::get<3ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    local_44 = *pvVar7;
    pvVar7 = (variant_alternative_t<3UL,_variant<char,_unsigned_int,_int,_float,_basic_string<char>_>_>
              *)operator_new(4);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)pvVar7;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pvVar7 + 1);
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(pvVar7 + 1);
    *pvVar7 = local_44;
    break;
  case '\x04':
    pvVar4 = std::get<4ul,char,unsigned_int,int,float,std::__cxx11::string>(v);
    pcVar2 = (pvVar4->_M_dataplus)._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar2,pcVar2 + pvVar4->_M_string_length);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,local_38 + 1,&local_46);
    if (local_38 != 0) {
      uVar5 = 0;
      do {
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start[uVar5] = *(uchar *)((long)local_40 + uVar5);
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_38);
    }
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish[-1] = '\0';
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    break;
  default:
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint8_t> Get(agvariant v)
		{
			if (std::holds_alternative<int>(v))
				return BitConverter::GetInt32(std::get<int>(v));
			else if (std::holds_alternative<char>(v))
				return { (uint8_t)std::get<char>(v) };
			else if (std::holds_alternative<unsigned int>(v))
				return BitConverter::GetUInt32(std::get<unsigned int>(v));
			else if (std::holds_alternative<float>(v))
				return BitConverter::GetFloat(std::get<float>(v));
			else if (std::holds_alternative<std::string>(v))
				return BitConverter::GetString(std::get<std::string>(v));
			return std::vector<uint8_t>();
		}